

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O3

void __thiscall QCborValue::QCborValue(QCborValue *this,QString *s)

{
  QStringView s_00;
  QCborContainerPrivate *this_00;
  
  s_00.m_data = (s->d).ptr;
  s_00.m_size = (s->d).size;
  this->n = 0;
  this_00 = (QCborContainerPrivate *)operator_new(0x40);
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i = 0;
  this_00->usedData = 0;
  (this_00->data).d.d = (Data *)0x0;
  (this_00->data).d.ptr = (char *)0x0;
  (this_00->data).d.size = 0;
  (this_00->elements).d.d = (Data *)0x0;
  (this_00->elements).d.ptr = (Element *)0x0;
  (this_00->elements).d.size = 0;
  this->container = this_00;
  this->t = String;
  QCborContainerPrivate::append(this_00,s_00);
  (this->container->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
  _q_value.super___atomic_base<int>._M_i = 1;
  return;
}

Assistant:

QCborValue::QCborValue(const QString &s) : QCborValue(qToStringViewIgnoringNull(s)) {}